

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O2

void frame_codec_destroy(FRAME_CODEC_HANDLE frame_codec)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (frame_codec != (FRAME_CODEC_HANDLE)0x0) {
    singlylinkedlist_destroy(frame_codec->subscription_list);
    free(frame_codec->receive_frame_bytes);
    free(frame_codec);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
               ,"frame_codec_destroy",0x78,1,"NULL frame_codec");
    return;
  }
  return;
}

Assistant:

void frame_codec_destroy(FRAME_CODEC_HANDLE frame_codec)
{
    /* Codes_SRS_FRAME_CODEC_01_024: [If frame_codec is NULL, frame_codec_destroy shall do nothing.] */
    if (frame_codec == NULL)
    {
        LogError("NULL frame_codec");
    }
    else
    {
        FRAME_CODEC_INSTANCE* frame_codec_data = (FRAME_CODEC_INSTANCE*)frame_codec;

        singlylinkedlist_destroy(frame_codec_data->subscription_list);
        if (frame_codec_data->receive_frame_bytes != NULL)
        {
            free(frame_codec_data->receive_frame_bytes);
        }

        /* Codes_SRS_FRAME_CODEC_01_023: [frame_codec_destroy shall free all resources associated with a frame_codec instance.] */
        free(frame_codec);
    }
}